

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::cpp::IsLazilyInitializedFile(cpp *this,string_view filename)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  bool local_a1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a0;
  cpp *local_90;
  char *local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  cpp *local_70;
  char *local_68;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_60;
  cpp *local_50;
  char *local_48;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_40;
  cpp *local_30;
  char *local_28;
  cpp *local_20;
  string_view filename_local;
  
  local_28 = (char *)filename._M_len;
  local_30 = this;
  local_20 = this;
  filename_local._M_len = (size_t)local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"third_party/protobuf/cpp_features.proto");
  __x_02._M_str = local_28;
  __x_02._M_len = (size_t)local_30;
  bVar1 = std::operator==(__x_02,local_40);
  if (!bVar1) {
    local_50 = local_20;
    local_48 = (char *)filename_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"google/protobuf/cpp_features.proto");
    __x_01._M_str = local_48;
    __x_01._M_len = (size_t)local_50;
    bVar1 = std::operator==(__x_01,local_60);
    if (!bVar1) {
      local_70 = local_20;
      local_68 = (char *)filename_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_80,"net/proto2/proto/descriptor.proto");
      __x_00._M_str = local_68;
      __x_00._M_len = (size_t)local_70;
      bVar1 = std::operator==(__x_00,local_80);
      local_a1 = true;
      if (!bVar1) {
        local_90 = local_20;
        local_88 = (char *)filename_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a0,"google/protobuf/descriptor.proto");
        __x._M_str = local_88;
        __x._M_len = (size_t)local_90;
        local_a1 = std::operator==(__x,local_a0);
      }
      return local_a1;
    }
  }
  return true;
}

Assistant:

bool IsLazilyInitializedFile(absl::string_view filename) {
  if (filename == "third_party/protobuf/cpp_features.proto" ||
      filename == "google/protobuf/cpp_features.proto") {
    return true;
  }
  return filename == "net/proto2/proto/descriptor.proto" ||
         filename == "google/protobuf/descriptor.proto";
}